

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflection_visit_fields_test.cc
# Opt level: O1

void __thiscall
google::protobuf::internal::anon_unknown_0::
VisitFieldsTest_VisitedMessageFieldsCountMatchesListFields_Test::
~VisitFieldsTest_VisitedMessageFieldsCountMatchesListFields_Test
          (VisitFieldsTest_VisitedMessageFieldsCountMatchesListFields_Test *this)

{
  (this->super_VisitFieldsTest).
  super_TestWithParam<google::protobuf::internal::(anonymous_namespace)::TestParam>.super_Test.
  _vptr_Test = (_func_int **)&PTR__VisitFieldsTest_01913730;
  (this->super_VisitFieldsTest).
  super_TestWithParam<google::protobuf::internal::(anonymous_namespace)::TestParam>.
  super_WithParamInterface<google::protobuf::internal::(anonymous_namespace)::TestParam>.
  _vptr_WithParamInterface = (_func_int **)&PTR__VisitFieldsTest_01913770;
  ThreadSafeArena::~ThreadSafeArena(&(this->super_VisitFieldsTest).arena_.impl_);
  testing::Test::~Test((Test *)this);
  operator_delete(this,0xd0);
  return;
}

Assistant:

TEST_P(VisitFieldsTest, VisitedMessageFieldsCountMatchesListFields) {
  uint32_t count = 0;
  VisitFields(*message_, [&](auto info) { ++count; }, FieldMask::kMessage);

  std::vector<const FieldDescriptor*> fields;
  reflection_->ListFields(*message_, &fields);
  int message_count = 0;
  for (auto field : fields) {
    if (field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE) ++message_count;
  }

  EXPECT_EQ(count, message_count);
}